

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

mir_size_t raw_type_size(c2m_ctx_t c2m_ctx,type *type)

{
  type *type_local;
  c2m_ctx_t c2m_ctx_local;
  
  if (type->raw_size == 0xffffffffffffffff) {
    set_type_layout(c2m_ctx,type);
  }
  if ((c2m_ctx->n_errors != 0) && (type->raw_size == 0xffffffffffffffff)) {
    type->raw_size = 0;
    type->align = 1;
  }
  if (type->raw_size != 0xffffffffffffffff) {
    return type->raw_size;
  }
  __assert_fail("type->raw_size != MIR_SIZE_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x147,"mir_size_t raw_type_size(c2m_ctx_t, struct type *)");
}

Assistant:

static mir_size_t raw_type_size (c2m_ctx_t c2m_ctx, struct type *type) {
  if (type->raw_size == MIR_SIZE_MAX) set_type_layout (c2m_ctx, type);
  if (n_errors != 0 && type->raw_size == MIR_SIZE_MAX) {
    /* Use safe values for programs with errors: */
    type->raw_size = 0;
    type->align = 1;
  }
  assert (type->raw_size != MIR_SIZE_MAX);
  return type->raw_size;
}